

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void string_suite::test_escape_tab(void)

{
  char input [5];
  decoder_type decoder;
  undefined4 local_18c;
  value_type local_188 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_188,"\"\\t\"",5);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            (&local_160,(value_type (*) [5])local_188);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65a,"void string_suite::test_escape_tab()",&local_180,&local_18c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_180,&local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.string_value<std::string>()","\"\\t\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65b,"void string_suite::test_escape_tab()",&local_180,"\t");
  std::__cxx11::string::~string((string *)&local_180);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_18c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65d,"void string_suite::test_escape_tab()",&local_180,&local_18c);
  return;
}

Assistant:

void test_escape_tab()
{
    const char input[] = "\"\\t\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\t");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}